

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_alloc_decryption_buffer(archive_read *a)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = a->format->data;
  if (*(long *)((long)pvVar1 + 0x1f50) == 0) {
    *(undefined8 *)((long)pvVar1 + 0x1f60) = 0x40000;
    pvVar2 = malloc(0x40000);
    *(void **)((long)pvVar1 + 0x1f50) = pvVar2;
    if (pvVar2 == (void *)0x0) {
      archive_set_error(&a->archive,0xc,"No memory for ZIP decryption");
      return L'\xffffffe2';
    }
  }
  *(undefined8 *)((long)pvVar1 + 0x1f58) = *(undefined8 *)((long)pvVar1 + 0x1f50);
  return L'\0';
}

Assistant:

static int
zip_alloc_decryption_buffer(struct archive_read *a)
{
	struct zip *zip = (struct zip *)(a->format->data);
	size_t bs = 256 * 1024;

	if (zip->decrypted_buffer == NULL) {
		zip->decrypted_buffer_size = bs;
		zip->decrypted_buffer = malloc(bs);
		if (zip->decrypted_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for ZIP decryption");
			return (ARCHIVE_FATAL);
		}
	}
	zip->decrypted_ptr = zip->decrypted_buffer;
	return (ARCHIVE_OK);
}